

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O2

reference __thiscall
slang::SmallVectorBase<std::__cxx11::string>::emplace_back<std::__cxx11::string>
          (SmallVectorBase<std::__cxx11::string> *this,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args)

{
  reference pbVar1;
  pointer pbVar2;
  
  pbVar2 = (pointer)(*(long *)(this + 8) * 0x20 + *(long *)this);
  if (*(long *)(this + 8) == *(long *)(this + 0x10)) {
    pbVar2 = emplaceRealloc<std::__cxx11::string>(this,pbVar2,args);
    return pbVar2;
  }
  std::__cxx11::string::string((string *)pbVar2,(string *)args);
  *(long *)(this + 8) = *(long *)(this + 8) + 1;
  pbVar1 = SmallVectorBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ::back((SmallVectorBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)this);
  return pbVar1;
}

Assistant:

reference emplace_back(Args&&... args) {
        if (len == cap)
            return *emplaceRealloc(end(), std::forward<Args>(args)...);

        new (end()) T(std::forward<Args>(args)...);
        len++;
        return back();
    }